

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symtab.c
# Opt level: O3

int symtab_put(symtab *tab,char *cname,int type,int data)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint32_t uVar4;
  char *str;
  symtab_sym *__ptr;
  ulong uVar5;
  int iVar6;
  int *piVar7;
  int *piVar8;
  uint uVar9;
  int iVar10;
  
  iVar3 = symtab_get(tab,cname,(int *)0x0,(int *)0x0);
  iVar10 = -1;
  if (iVar3 == -1) {
    str = strdup(cname);
    uVar4 = elf_hash(str);
    uVar9 = uVar4 % (uint)tab->bucketsnum;
    iVar10 = tab->symsnum;
    iVar3 = tab->buckets[(int)uVar9];
    tab->buckets[(int)uVar9] = iVar10;
    iVar1 = tab->symsmax;
    __ptr = tab->syms;
    iVar6 = iVar10;
    if (iVar1 <= iVar10) {
      iVar6 = 0x10;
      if (iVar1 != 0) {
        iVar6 = iVar1 * 2;
      }
      tab->symsmax = iVar6;
      __ptr = (symtab_sym *)realloc(__ptr,(long)iVar6 * 0x18);
      tab->syms = __ptr;
      iVar6 = tab->symsnum;
    }
    tab->symsnum = iVar6 + 1;
    __ptr[iVar6].name = str;
    __ptr[iVar6].hash = uVar4;
    __ptr[iVar6].hchain = iVar3;
    __ptr[iVar6].type = type;
    __ptr[iVar6].data = data;
    if (tab->bucketsnum != 0x10000000 && tab->bucketsnum < tab->symsnum) {
      free(tab->buckets);
      uVar9 = tab->symsnum;
      piVar7 = primes;
      uVar5 = 0;
      do {
        if ((int)uVar9 <= *piVar7) goto LAB_0026dca5;
        uVar5 = uVar5 + 1;
        piVar7 = piVar7 + 1;
      } while (uVar5 != 0xb);
      uVar5 = 0xb;
LAB_0026dca5:
      uVar2 = primes[uVar5 & 0xffffffff];
      tab->bucketsnum = uVar2;
      piVar7 = (int *)malloc((long)(int)uVar2 << 2);
      tab->buckets = piVar7;
      uVar5 = 1;
      if (1 < (int)uVar2) {
        uVar5 = (ulong)uVar2;
      }
      memset(piVar7,0xff,uVar5 << 2);
      if (0 < (int)uVar9) {
        piVar8 = &tab->syms->hchain;
        uVar5 = 0;
        do {
          *piVar8 = piVar7[(int)((uint)piVar8[-1] % uVar2)];
          piVar7[(int)((uint)piVar8[-1] % uVar2)] = (int)uVar5;
          uVar5 = uVar5 + 1;
          piVar8 = piVar8 + 6;
        } while (uVar9 != uVar5);
      }
    }
  }
  return iVar10;
}

Assistant:

int symtab_put(struct symtab *tab, const char *cname, int type, int data) {
	if (symtab_get(tab, cname, 0, 0) != -1)
		return -1;
	char *name = strdup(cname);
	struct symtab_sym sym;
	uint32_t hash = elf_hash(name);
	int bucket = hash % tab->bucketsnum;
	int res = tab->symsnum;
	sym.name = name;
	sym.type = type;
	sym.data = data;
	sym.hash = hash;
	sym.hchain = tab->buckets[bucket];
	tab->buckets[bucket] = res;
	ADDARRAY(tab->syms, sym);
	if (tab->symsnum > tab->bucketsnum && tab->bucketsnum != primes[numprimes-1]) {
		/* rehash */
		int i;
		free(tab->buckets);
		for (i = 0; i < numprimes-1; i++)
			if (tab->symsnum <= primes[i])
				break;
		tab->bucketsnum = primes[i];
		tab->buckets = malloc(tab->bucketsnum * sizeof *tab->buckets);
		for (i = 0; i < tab->bucketsnum; i++)
			tab->buckets[i] = -1;
		for (i = 0; i < tab->symsnum; i++) {
			bucket = tab->syms[i].hash % tab->bucketsnum;
			tab->syms[i].hchain = tab->buckets[bucket];
			tab->buckets[bucket] = i;
		}
	}
	return res;
}